

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O0

void __thiscall QWidgetLineControl::cursorForward(QWidgetLineControl *this,bool mark,int steps)

{
  int iVar1;
  CursorMoveStyle CVar2;
  CursorMode CVar3;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  int c;
  int iVar4;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar5;
  int pos;
  
  uVar5 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  CVar3 = *(CursorMode *)(in_RDI + 0x40);
  iVar1 = (int)in_RDI;
  iVar4 = in_EDX;
  if (in_EDX < 1) {
    if (in_EDX < 0) {
      while (in_EDX = iVar4 + 1, iVar4 != 0) {
        CVar2 = cursorMoveStyle((QWidgetLineControl *)0x5cc61c);
        if (CVar2 == VisualMoveStyle) {
          CVar3 = QTextLayout::leftCursorPosition(iVar1 + 0x118);
          iVar4 = in_EDX;
        }
        else {
          CVar3 = QTextLayout::previousCursorPosition(iVar1 + 0x118,CVar3);
          iVar4 = in_EDX;
        }
      }
    }
    pos = (int)((ulong)in_RDI >> 0x20);
  }
  else {
    while( true ) {
      pos = (int)((ulong)in_RDI >> 0x20);
      in_EDX = iVar4 + -1;
      if (iVar4 == 0) break;
      CVar2 = cursorMoveStyle((QWidgetLineControl *)0x5cc5b0);
      if (CVar2 == VisualMoveStyle) {
        CVar3 = QTextLayout::rightCursorPosition(iVar1 + 0x118);
        iVar4 = in_EDX;
      }
      else {
        CVar3 = QTextLayout::nextCursorPosition(iVar1 + 0x118,CVar3);
        iVar4 = in_EDX;
      }
    }
  }
  moveCursor((QWidgetLineControl *)CONCAT44(uVar5,in_EDX),pos,SUB41(CVar3 >> 0x18,0));
  return;
}

Assistant:

void cursorForward(bool mark, int steps)
    {
        int c = m_cursor;
        if (steps > 0) {
            while (steps--)
                c = cursorMoveStyle() == Qt::VisualMoveStyle ? m_textLayout.rightCursorPosition(c)
                                                             : m_textLayout.nextCursorPosition(c);
        } else if (steps < 0) {
            while (steps++)
                c = cursorMoveStyle() == Qt::VisualMoveStyle ? m_textLayout.leftCursorPosition(c)
                                                             : m_textLayout.previousCursorPosition(c);
        }
        moveCursor(c, mark);
    }